

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  
LAB_0019fdbd:
  do {
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar2 = (*(s->io).eof)(s->io_user_data);
      if (iVar2 == 0) goto LAB_0019fde7;
      if (s->read_from_callbacks != 0) goto LAB_0019fdd7;
LAB_0019fe03:
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar2 = (*(s->io).eof)(s->io_user_data);
        if (iVar2 == 0) goto LAB_0019fe2d;
        if (s->read_from_callbacks == 0) {
          return;
        }
      }
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
LAB_0019fe2d:
      if (*c != '#') {
        return;
      }
      do {
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0019fe50:
          if (s->img_buffer_end <= s->img_buffer) goto LAB_0019fdbd;
        }
        else {
          iVar2 = (*(s->io).eof)(s->io_user_data);
          if (iVar2 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_0019fe50;
            goto LAB_0019fdbd;
          }
        }
        if ((*c == '\n') || (*c == '\r')) goto LAB_0019fdbd;
        sVar1 = stbi__get8(s);
        *c = sVar1;
      } while( true );
    }
LAB_0019fdd7:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_0019fe03;
LAB_0019fde7:
    if ((4 < (byte)*c - 9) && (*c != 0x20)) goto LAB_0019fe03;
    sVar1 = stbi__get8(s);
    *c = sVar1;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}